

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

find_result __thiscall
unodb::detail::
basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::find_child(basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
             *this,byte key_byte)

{
  bool bVar1;
  reference this_00;
  pair<unsigned_char,_unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>_*>
  pVar2;
  find_result fVar3;
  reference local_30;
  byte local_22;
  byte local_21;
  uint8_t key_int_byte;
  basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbStack_20;
  byte key_byte_local;
  basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *local_10;
  
  local_22 = key_byte;
  local_21 = key_byte;
  pbStack_20 = this;
  this_00 = std::
            array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_256UL>
            ::operator[](&this->children,(ulong)key_byte);
  bVar1 = in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>::
          operator==(this_00,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_local._0_1_ = 0xff;
    local_10 = (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
                *)0x0;
  }
  else {
    local_30 = std::
               array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_256UL>
               ::operator[](&this->children,(ulong)local_22);
    pVar2 = std::
            make_pair<unsigned_char_const&,unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>>*>
                      (&local_22,&local_30);
    local_10 = pVar2.second;
    this_local._0_1_ = pVar2.first;
  }
  fVar3._1_7_ = (undefined7)((ulong)local_10 >> 8);
  fVar3.first = (uchar)this_local;
  fVar3.second = local_10;
  return fVar3;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_256::find_result
  find_child(std::byte key_byte) noexcept {
    const auto key_int_byte = static_cast<std::uint8_t>(key_byte);
    if (children[key_int_byte] != nullptr)
      return std::make_pair(key_int_byte, &children[key_int_byte]);
    return parent_class::child_not_found;
  }